

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v8::detail::digit_grouping<char8_t>::digit_grouping
          (digit_grouping<char8_t> *this,locale_ref loc,bool localized)

{
  undefined7 in_register_00000011;
  thousands_sep_result<char> result;
  long local_68;
  long local_60;
  undefined1 *local_40 [2];
  undefined1 local_30 [24];
  
  (this->sep_).grouping._M_dataplus._M_p = (pointer)&(this->sep_).grouping.field_2;
  (this->sep_).grouping._M_string_length = 0;
  (this->sep_).grouping.field_2._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000011,localized) == 0) {
    (this->sep_).thousands_sep = '\0';
  }
  else {
    fmt::v8::detail::thousands_sep_impl<char>((locale_ref)&local_68);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char*>((string *)local_40,local_68,local_60 + local_68);
    detail::digit_grouping();
  }
  return;
}

Assistant:

explicit digit_grouping(locale_ref loc, bool localized = true) {
    if (localized)
      sep_ = thousands_sep<Char>(loc);
    else
      sep_.thousands_sep = Char();
  }